

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

int If_Dec7PickBestMux(word *t,word *c0r,word *c1r)

{
  int iVar1;
  int iVar2;
  int local_5c;
  int CountBest;
  int Count1;
  int Count0;
  int vBest;
  int v;
  word c1 [2];
  word c0 [2];
  word *c1r_local;
  word *c0r_local;
  word *t_local;
  
  Count1 = -1;
  local_5c = 1000;
  for (Count0 = 0; Count0 < 7; Count0 = Count0 + 1) {
    If_Dec7Cofactor(t,Count0,0,c1 + 1);
    If_Dec7Cofactor(t,Count0,1,(word *)&vBest);
    iVar1 = If_Dec7SuppSize(c1 + 1);
    iVar2 = If_Dec7SuppSize((word *)&vBest);
    if (((iVar1 < 5) && (iVar2 < 5)) && (iVar1 + iVar2 < local_5c)) {
      local_5c = iVar1 + iVar2;
      Count1 = Count0;
      *c0r = c1[1];
      c0r[1] = c0[0];
      *c1r = _vBest;
      c1r[1] = c1[0];
    }
  }
  return Count1;
}

Assistant:

int If_Dec7PickBestMux( word t[2], word c0r[2], word c1r[2] )
{
    word c0[2], c1[2];
    int v, vBest = -1, Count0, Count1, CountBest = 1000;
    for ( v = 0; v < 7; v++ )
    {
        If_Dec7Cofactor( t, v, 0, c0 );
        If_Dec7Cofactor( t, v, 1, c1 );
        Count0 = If_Dec7SuppSize(c0);
        Count1 = If_Dec7SuppSize(c1);
        if ( Count0 < 5 && Count1 < 5 && CountBest > Count0 + Count1 )
        {
            CountBest = Count0 + Count1;
            vBest = v;
            c0r[0] = c0[0]; c0r[1] = c0[1];
            c1r[0] = c1[0]; c1r[1] = c1[1];
        }
    }
    return vBest;
}